

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

deMemPool * deMemPool_create(deMemPool *parent)

{
  deMemPool *pdVar1;
  deMemPool *pool;
  deMemPool *parent_local;
  
  pdVar1 = createPoolInternal(parent);
  if ((pdVar1 == (deMemPool *)0x0) && (parent->util != (deMemPoolUtil *)0x0)) {
    (*parent->util->allocFailCallback)(parent->util->userPointer);
  }
  return pdVar1;
}

Assistant:

deMemPool* deMemPool_create (deMemPool* parent)
{
	deMemPool* pool;
	DE_ASSERT(parent);
	pool = createPoolInternal(parent);
	if (!pool && parent->util)
		parent->util->allocFailCallback(parent->util->userPointer);
	return pool;
}